

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_convert_from_struct_tm(png_timep ptime,tm *ttime)

{
  tm *ttime_local;
  png_timep ptime_local;
  
  ptime->year = (short)ttime->tm_year + 0x76c;
  ptime->month = (char)ttime->tm_mon + '\x01';
  ptime->day = (png_byte)ttime->tm_mday;
  ptime->hour = (png_byte)ttime->tm_hour;
  ptime->minute = (png_byte)ttime->tm_min;
  ptime->second = (png_byte)ttime->tm_sec;
  return;
}

Assistant:

void PNGAPI
png_convert_from_struct_tm(png_timep ptime, const struct tm * ttime)
{
   png_debug(1, "in png_convert_from_struct_tm");

   ptime->year = (png_uint_16)(1900 + ttime->tm_year);
   ptime->month = (png_byte)(ttime->tm_mon + 1);
   ptime->day = (png_byte)ttime->tm_mday;
   ptime->hour = (png_byte)ttime->tm_hour;
   ptime->minute = (png_byte)ttime->tm_min;
   ptime->second = (png_byte)ttime->tm_sec;
}